

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O0

void __thiscall ncnn::DeformableConv2D_x86::DeformableConv2D_x86(DeformableConv2D_x86 *this)

{
  undefined8 *in_RDI;
  DeformableConv2D *in_stack_fffffffffffffff8;
  
  DeformableConv2D::DeformableConv2D(in_stack_fffffffffffffff8);
  *in_RDI = &PTR__DeformableConv2D_x86_020211c8;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  in_RDI[0x41] = 0;
  *(undefined4 *)(in_RDI + 0x42) = 0;
  *(undefined4 *)((long)in_RDI + 0x214) = 0;
  *(undefined4 *)(in_RDI + 0x43) = 0;
  *(undefined4 *)((long)in_RDI + 0x21c) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  in_RDI[0x45] = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 1;
  in_RDI[0x3c] = 0;
  in_RDI[0x46] = 0;
  return;
}

Assistant:

DeformableConv2D_x86::DeformableConv2D_x86()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    activation = 0;
    gemm = 0;
}